

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::TessEvaluationExecutor::
generateTessEvalShader_abi_cxx11_
          (string *__return_storage_ptr__,TessEvaluationExecutor *this,ShaderSpec *shaderSpec)

{
  ulong uVar1;
  ostream *poVar2;
  ostringstream local_190 [8];
  ostringstream src;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,
                  "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_190,(string *)(this + 0x30));
    std::operator<<(poVar2,"\n");
  }
  std::operator<<((ostream *)local_190,"\n");
  std::operator<<((ostream *)local_190,"layout(isolines, equal_spacing) in;\n\n");
  shaderexecutor::anon_unknown_0::BufferIoExecutor::declareBufferBlocks
            ((ostream *)local_190,(ShaderSpec *)this);
  poVar2 = std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar2,
                  "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
                 );
  shaderexecutor::anon_unknown_0::BufferIoExecutor::generateExecBufferIo
            ((ostream *)local_190,(ShaderSpec *)this,"invocationId");
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TessEvaluationExecutor::generateTessEvalShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src <<  "#version 310 es\n"
			"#extension GL_EXT_tessellation_shader : require\n\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\n";

	src << "layout(isolines, equal_spacing) in;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n"
		<< "\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src	<< "}\n";

	return src.str();
}